

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

uint __thiscall llvm::APInt::countTrailingOnesSlowCase(APInt *this)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  
  uVar5 = (ulong)this->BitWidth + 0x3f;
  puVar6 = (this->U).pVal;
  uVar2 = (uint)uVar5 & 0xffffffc0;
  lVar4 = 0;
  while( true ) {
    if ((uVar5 & 0xffffffffffffffc0) + lVar4 == 0) goto LAB_00182eef;
    if (*puVar6 != 0xffffffffffffffff) break;
    puVar6 = puVar6 + 1;
    lVar4 = lVar4 + -0x40;
  }
  uVar5 = *puVar6 ^ 0xffffffffffffffff;
  if (uVar5 == 0) {
    iVar3 = 0x40;
  }
  else {
    lVar1 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    iVar3 = (int)lVar1;
  }
  uVar2 = iVar3 - (int)lVar4;
LAB_00182eef:
  if (uVar2 <= this->BitWidth) {
    return uVar2;
  }
  __assert_fail("Count <= BitWidth",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x24d,"unsigned int llvm::APInt::countTrailingOnesSlowCase() const");
}

Assistant:

unsigned APInt::countTrailingOnesSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == WORD_MAX; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingOnes(U.pVal[i]);
  assert(Count <= BitWidth);
  return Count;
}